

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

void Kit_DsdNtkFree(Kit_DsdNtk_t *pNtk)

{
  ulong uVar1;
  
  if (pNtk->nNodes != 0) {
    uVar1 = 0;
    do {
      if (pNtk->pNodes[uVar1] == (Kit_DsdObj_t *)0x0) break;
      free(pNtk->pNodes[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < pNtk->nNodes);
  }
  if (pNtk->pSupps != (uint *)0x0) {
    free(pNtk->pSupps);
    pNtk->pSupps = (uint *)0x0;
  }
  if (pNtk->pNodes != (Kit_DsdObj_t **)0x0) {
    free(pNtk->pNodes);
    pNtk->pNodes = (Kit_DsdObj_t **)0x0;
  }
  if (pNtk->pMem != (uint *)0x0) {
    free(pNtk->pMem);
    pNtk->pMem = (uint *)0x0;
  }
  if (pNtk != (Kit_DsdNtk_t *)0x0) {
    free(pNtk);
    return;
  }
  return;
}

Assistant:

void Kit_DsdNtkFree( Kit_DsdNtk_t * pNtk )
{
    Kit_DsdObj_t * pObj;
    unsigned i;
    Kit_DsdNtkForEachObj( pNtk, pObj, i )
        ABC_FREE( pObj );
    ABC_FREE( pNtk->pSupps );
    ABC_FREE( pNtk->pNodes );
    ABC_FREE( pNtk->pMem );
    ABC_FREE( pNtk );
}